

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav_read_pcm_frames_s32(ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int32 *pBufferOut)

{
  long in_RDX;
  void *in_RSI;
  ma_uint64 in_RDI;
  ma_int32 *in_stack_00001000;
  ma_int32 *in_stack_00001008;
  ma_dr_wav *in_stack_00001010;
  ma_dr_wav *in_stack_00001018;
  ma_dr_wav *in_stack_fffffffffffffff8;
  ma_uint64 mVar1;
  
  if ((in_RDI == 0) || (in_RSI == (void *)0x0)) {
    mVar1 = 0;
  }
  else if (in_RDX == 0) {
    mVar1 = ma_dr_wav_read_pcm_frames(in_stack_fffffffffffffff8,in_RDI,in_RSI);
  }
  else if (*(short *)(in_RDI + 0x74) == 1) {
    mVar1 = ma_dr_wav_read_pcm_frames_s32__pcm
                      (in_stack_00001018,(ma_uint64)in_stack_00001010,in_stack_00001008);
  }
  else if ((*(short *)(in_RDI + 0x74) == 2) || (*(short *)(in_RDI + 0x74) == 0x11)) {
    mVar1 = ma_dr_wav_read_pcm_frames_s32__msadpcm_ima
                      (in_stack_00001010,(ma_uint64)in_stack_00001008,in_stack_00001000);
  }
  else if (*(short *)(in_RDI + 0x74) == 3) {
    mVar1 = ma_dr_wav_read_pcm_frames_s32__ieee
                      (in_stack_00001018,(ma_uint64)in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x74) == 6) {
    mVar1 = ma_dr_wav_read_pcm_frames_s32__alaw
                      (in_stack_00001018,(ma_uint64)in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x74) == 7) {
    mVar1 = ma_dr_wav_read_pcm_frames_s32__mulaw
                      (in_stack_00001018,(ma_uint64)in_stack_00001010,in_stack_00001008);
  }
  else {
    mVar1 = 0;
  }
  return mVar1;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_s32(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int32* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_wav_read_pcm_frames(pWav, framesToRead, NULL);
    }
    if (framesToRead * pWav->channels * sizeof(ma_int32) > MA_SIZE_MAX) {
        framesToRead = MA_SIZE_MAX / sizeof(ma_int32) / pWav->channels;
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_PCM) {
        return ma_dr_wav_read_pcm_frames_s32__pcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM || pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return ma_dr_wav_read_pcm_frames_s32__msadpcm_ima(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_IEEE_FLOAT) {
        return ma_dr_wav_read_pcm_frames_s32__ieee(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ALAW) {
        return ma_dr_wav_read_pcm_frames_s32__alaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_MULAW) {
        return ma_dr_wav_read_pcm_frames_s32__mulaw(pWav, framesToRead, pBufferOut);
    }
    return 0;
}